

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

size_t io::
       read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
                 (file *stream,
                 dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *b,
                 error_code *ec)

{
  size_t sVar1;
  error_category *peVar2;
  
  sVar1 = net::
          read<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,io::net::transfer_all,void>
                    ();
  peVar2 = net::stream_category();
  if ((ec->_M_cat == peVar2) && (ec->_M_value == 1)) {
    std::error_code::clear(ec);
  }
  return sVar1;
}

Assistant:

std::size_t read_all(SyncReadStream& stream, DynamicBuffer&& b, std::error_code& ec)
{
    std::size_t bytes_read = io::read(stream, std::forward<DynamicBuffer>(b), ec);
    if (ec == stream_errc::eof) {
        ec.clear();
    }
    return bytes_read;
}